

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

precise_unit __thiscall units::precise_unit::operator/(precise_unit *this,precise_unit *other)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  unit_data uVar5;
  ulong uVar6;
  precise_unit pVar7;
  
  dVar1 = this->multiplier_;
  dVar2 = other->multiplier_;
  uVar5 = detail::unit_data::operator/(&this->base_units_,&other->base_units_);
  uVar3 = this->commodity_;
  uVar6 = (ulong)uVar3;
  uVar4 = other->commodity_;
  if (uVar3 == 0) {
    uVar6 = (ulong)~uVar4;
    if (uVar4 == 0) {
      uVar6 = 0;
    }
  }
  else if (uVar4 != 0) {
    uVar6 = (ulong)(uVar3 & ~uVar4);
  }
  pVar7.multiplier_ = dVar1 / dVar2;
  pVar7._8_8_ = (ulong)(uint)uVar5 | uVar6 << 0x20;
  return pVar7;
}

Assistant:

constexpr precise_unit operator/(const precise_unit& other) const
    {
        return {
            multiplier() / other.multiplier(),
            base_units_ / other.base_units_,
            (commodity_ == 0) ?
                ((other.commodity_ == 0) ? 0 : ~other.commodity_) :
                ((other.commodity_ == 0) ? commodity_ :
                                           commodity_ & (~other.commodity_)),
        };
    }